

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

void language::formatConnection
               (QTextStream *str,SignalSlot *sender,SignalSlot *receiver,
               ConnectionSyntax connectionSyntax)

{
  char16_t *pcVar1;
  bool bVar2;
  QTextStream *pQVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_language == 1) {
    uVar4 = QString::indexOf(&sender->signature,(QChar)0x28,0,CaseSensitive);
    pcVar1 = (sender->signature).d.ptr;
    uVar6 = (sender->signature).d.size;
    local_48.m_size = uVar6;
    local_48.m_data = pcVar1;
    pQVar3 = (QTextStream *)QTextStream::operator<<(str,&sender->name);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'.');
    uVar5 = uVar6;
    if (uVar4 <= uVar6) {
      uVar5 = uVar4;
    }
    QVar7.m_data = pcVar1;
    QVar7.m_size = uVar5;
    QTextStream::operator<<(pQVar3,QVar7);
    if (((sender->options).super_QFlagsStorageHelper<language::SignalSlotOption,_4>.
         super_QFlagsStorage<language::SignalSlotOption>.i & 1) != 0) {
      local_58 = QStringView::mid(&local_48,uVar4 + 1,(uVar6 - uVar4) + -2);
      if (local_58.m_size != 0) {
        bVar2 = QStringView::contains(&local_58,(QChar)0x2c,CaseSensitive);
        if (!bVar2) {
          pQVar3 = (QTextStream *)QTextStream::operator<<(str,"[\"");
          pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,local_58);
          QTextStream::operator<<(pQVar3,"\"]");
        }
      }
    }
    pQVar3 = (QTextStream *)QTextStream::operator<<(str,".connect(");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&receiver->name);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'.');
    pcVar1 = (receiver->signature).d.ptr;
    uVar6 = (receiver->signature).d.size;
    uVar5 = QString::indexOf(&receiver->signature,(QChar)0x28,0,CaseSensitive);
    if (uVar5 <= uVar6) {
      uVar6 = uVar5;
    }
    QVar8.m_data = pcVar1;
    QVar8.m_size = uVar6;
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,QVar8);
    QTextStream::operator<<(pQVar3,')');
  }
  else if (_language == 0) {
    if (connectionSyntax == StringBased) {
      pQVar3 = (QTextStream *)QTextStream::operator<<(str,"QObject::connect(");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&sender->name);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,", SIGNAL(");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&sender->signature);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"), ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&receiver->name);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,", SLOT(");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&receiver->signature);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QTextStream::operator<<(pQVar3,"))");
        return;
      }
      goto LAB_001491fe;
    }
    if (connectionSyntax == MemberFunctionPtr) {
      pQVar3 = (QTextStream *)QTextStream::operator<<(str,"QObject::connect(");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&sender->name);
      QTextStream::operator<<(pQVar3,", ");
      formatMemberFnPtr(str,sender,Never);
      pQVar3 = (QTextStream *)QTextStream::operator<<(str,", ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&receiver->name);
      QTextStream::operator<<(pQVar3,", ");
      formatMemberFnPtr(str,receiver,WhenAmbiguousOrEmpty);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QTextStream::operator<<(str,')');
        return;
      }
      goto LAB_001491fe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001491fe:
  __stack_chk_fail();
}

Assistant:

void formatConnection(QTextStream &str, const SignalSlot &sender, const SignalSlot &receiver,
                      ConnectionSyntax connectionSyntax)
{
    switch (language()) {
    case Language::Cpp:
        switch (connectionSyntax) {
        case ConnectionSyntax::MemberFunctionPtr:
            formatMemberFnPtrConnection(str, sender, receiver);
            break;
        case ConnectionSyntax::StringBased:
            formatStringBasedConnection(str, sender, receiver);
            break;
        }
        break;
    case Language::Python: {
        const auto paren = sender.signature.indexOf(u'(');
        auto senderSignature = QStringView{sender.signature};
        str << sender.name << '.' << senderSignature.left(paren);
        // Signals like "QAbstractButton::clicked(checked=false)" require
        // the parameter if it is used.
        if (sender.options.testFlag(SignalSlotOption::Ambiguous)) {
            const QStringView parameters =
                senderSignature.mid(paren + 1, senderSignature.size() - paren - 2);
            if (!parameters.isEmpty() && !parameters.contains(u','))
                str << "[\"" << parameters << "\"]";
        }
        str << ".connect(" << receiver.name << '.'
            << QStringView{receiver.signature}.left(receiver.signature.indexOf(u'('))
            << ')';
    }
        break;
    }
}